

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertEqualMemory
               (void *expected,void *actual,_UU32 length,_UU32 num_elements,char *msg,
               _U_UINT lineNumber)

{
  int iVar1;
  _UU32 _Var2;
  _UU32 local_48;
  _UU32 local_44;
  _UU32 bytes;
  _UU32 elements;
  uchar *ptr_act;
  uchar *ptr_exp;
  _U_UINT lineNumber_local;
  char *msg_local;
  _UU32 num_elements_local;
  _UU32 length_local;
  void *actual_local;
  void *expected_local;
  
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    if ((num_elements == 0) || (length == 0)) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    iVar1 = UnityCheckArraysForNull(expected,actual,lineNumber,msg);
    local_44 = num_elements;
    _bytes = (byte *)actual;
    ptr_act = (uchar *)expected;
    if (iVar1 != 1) {
      while (_Var2 = local_44 - 1, local_48 = length, local_44 != 0) {
        while (local_44 = _Var2, local_48 != 0) {
          if (*ptr_act != *_bytes) {
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(" Memory Mismatch.");
            if (1 < num_elements) {
              UnityPrint(" Element ");
              UnityPrintNumberUnsigned((ulong)((num_elements - _Var2) - 1));
            }
            UnityPrint(" Byte ");
            UnityPrintNumberUnsigned((ulong)((length - (local_48 - 1)) - 1));
            UnityPrint(" Expected ");
            UnityPrintNumberByStyle((ulong)*ptr_act,UNITY_DISPLAY_STYLE_HEX8);
            UnityPrint(" Was ");
            UnityPrintNumberByStyle((ulong)*_bytes,UNITY_DISPLAY_STYLE_HEX8);
            UnityAddMsgIfSpecified(msg);
            Unity.CurrentTestFailed = 1;
            longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
          }
          ptr_act = ptr_act + 1;
          _bytes = _bytes + 1;
          local_48 = local_48 - 1;
        }
      }
    }
  }
  return;
}

Assistant:

void UnityAssertEqualMemory( UNITY_INTERNAL_PTR expected,
                             UNITY_INTERNAL_PTR actual,
                             const _UU32 length,
                             const _UU32 num_elements,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber)
{
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_act = (UNITY_PTR_ATTRIBUTE const unsigned char*)actual;
    _UU32 elements = num_elements;
    _UU32 bytes;

    UNITY_SKIP_EXECUTION;

    if ((elements == 0) || (length == 0))
    {
        UnityPrintPointlessAndBail();
    }

    if (UnityCheckArraysForNull((UNITY_INTERNAL_PTR)expected, (UNITY_INTERNAL_PTR)actual, lineNumber, msg) == 1)
        return;

    while (elements--)
    {
        /* /////////////////////////////////// */
        bytes = length;
        while (bytes--)
        {
            if (*ptr_exp != *ptr_act)
            {
                UnityTestResultsFailBegin(lineNumber);
                UnityPrint(UnityStrMemory);
                if (num_elements > 1)
                {
                    UnityPrint(UnityStrElement);
                    UnityPrintNumberUnsigned(num_elements - elements - 1);
                }
                UnityPrint(UnityStrByte);
                UnityPrintNumberUnsigned(length - bytes - 1);
                UnityPrint(UnityStrExpected);
                UnityPrintNumberByStyle(*ptr_exp, UNITY_DISPLAY_STYLE_HEX8);
                UnityPrint(UnityStrWas);
                UnityPrintNumberByStyle(*ptr_act, UNITY_DISPLAY_STYLE_HEX8);
                UnityAddMsgIfSpecified(msg);
                UNITY_FAIL_AND_BAIL;
            }
            ptr_exp = (UNITY_INTERNAL_PTR)((_UP)ptr_exp + 1);
            ptr_act = (UNITY_INTERNAL_PTR)((_UP)ptr_act + 1);
        }
        /* /////////////////////////////////// */

    }
}